

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Normal3f *n;
  undefined8 uVar1;
  bool bVar2;
  ShapeIntersection *this_00;
  ShapeIntersection *pSVar3;
  int iVar4;
  anon_class_8_1_5ef94505 samp;
  undefined1 auVar5 [16];
  ulong uVar16;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar18 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  ulong uVar23;
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar24 [16];
  Vector3<float> VVar25;
  Normal3<float> z;
  Vector3f VVar26;
  SampledSpectrum SVar27;
  SampledSpectrum b;
  Vector3f local_390;
  float local_380;
  Float local_37c;
  SamplerHandle *local_378;
  Point2f u;
  SampledSpectrum local_340;
  TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
  *local_330;
  Tuple3<pbrt::Vector3,_float> *local_328;
  ScratchBuffer *local_320;
  Tuple3<pbrt::Vector3,_float> local_318;
  uintptr_t local_308;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_300;
  SampledSpectrum local_2f8;
  anon_struct_8_0_00000001_for___align local_2e8;
  float fStack_2e0;
  float local_2dc;
  MediumHandle local_2c8;
  SampledSpectrum local_2c0;
  SampledSpectrum L;
  BSDF bsdf;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_268;
  Frame f;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar10 [64];
  undefined1 auVar17 [56];
  undefined1 extraout_var [56];
  
  local_378 = sampler;
  local_320 = scratchBuffer;
  SampledSpectrum::SampledSpectrum(&L,0.0);
  local_328 = &(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
  local_330 = (TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
               *)&this->illuminant;
  si.set = false;
  do {
    auVar17 = (undefined1  [56])0x0;
    Integrator::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_268.__align,(Integrator *)this,
               &ray->super_Ray,INFINITY);
    pstd::optional<pbrt::ShapeIntersection>::operator=
              (&si,(optional<pbrt::ShapeIntersection> *)&local_268.__align);
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)&local_268.__align);
    if (si.set != true) goto LAB_003d1ff6;
    this_00 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    local_300.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_308 = (local_378->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
    SurfaceInteraction::GetBSDF
              (&bsdf,&this_00->intr,ray,lambda,(CameraHandle *)&local_300,local_320,
               (SamplerHandle)&local_308);
    auVar22 = in_ZMM1._4_60_;
    if (((ulong)bsdf.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits & 0xffffffffffff) == 0) {
      pSVar3 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      SurfaceInteraction::SkipIntersection(&this_00->intr,ray,pSVar3->tHit);
      iVar4 = 2;
    }
    else {
      VVar25 = Tuple3<pbrt::Vector3,_float>::operator-(local_328);
      local_268._8_4_ = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar17;
      n = &(this_00->intr).super_Interaction.n;
      local_268.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar6._0_16_);
      z = FaceForward<float>(n,(Vector3<float> *)&local_268.__align);
      auVar7._0_8_ = z.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar7._8_56_ = auVar17;
      VVar25 = Normalize<float>(&(this_00->intr).dpdu);
      local_318.z = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar17;
      local_318._0_8_ = vmovlps_avx(auVar8._0_16_);
      VVar25 = Cross<float>(n,(Vector3<float> *)&local_318);
      auVar19._0_4_ = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._4_60_ = auVar22;
      local_390.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      local_390.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      local_390.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      auVar9._0_8_ = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                               (VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_,auVar19._0_8_,
                                local_378);
      auVar22 = auVar19._4_60_;
      auVar9._8_56_ = extraout_var;
      u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9._0_16_);
      if (this->cosSample == true) {
        auVar17 = extraout_var;
        VVar26 = SampleCosineHemisphere(&u);
        in_ZMM1._0_4_ = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
        in_ZMM1._4_60_ = auVar22;
        auVar10._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar17;
        uVar1 = vmovlps_avx(auVar10._0_16_);
        local_390.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
        local_390.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar5 = vandps_avx512vl(in_ZMM1._0_16_,auVar5);
        local_380 = auVar5._0_4_ * 0.31830987;
        local_390.super_Tuple3<pbrt::Vector3,_float>.z = in_ZMM1._0_4_;
        if ((local_380 == 0.0) && (!NAN(local_380))) {
          SampledSpectrum::SampledSpectrum(&local_340,0.0);
          iVar4 = 1;
          goto LAB_003d1fe9;
        }
      }
      else {
        auVar17 = extraout_var;
        VVar26 = SampleUniformHemisphere(&u);
        local_390.super_Tuple3<pbrt::Vector3,_float>.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z
        ;
        auVar11._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar11._8_56_ = auVar17;
        uVar1 = vmovlps_avx(auVar11._0_16_);
        local_390.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
        local_390.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
        local_380 = 0.15915494;
      }
      Frame::FromZ(&f,(Vector3f)z.super_Tuple3<pbrt::Normal3,_float>);
      VVar26.super_Tuple3<pbrt::Vector3,_float>.y = local_390.super_Tuple3<pbrt::Vector3,_float>.y;
      VVar26.super_Tuple3<pbrt::Vector3,_float>.x = local_390.super_Tuple3<pbrt::Vector3,_float>.x;
      VVar26.super_Tuple3<pbrt::Vector3,_float>.z = local_390.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17 = ZEXT856(0);
      VVar26 = Frame::FromLocal(&f,VVar26);
      local_390.super_Tuple3<pbrt::Vector3,_float>.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar17;
      uVar1 = vmovlps_avx(auVar12._0_16_);
      local_390.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
      local_390.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
      Interaction::SpawnRay((RayDifferential *)&local_268.__align,(Interaction *)this_00,&local_390)
      ;
      in_ZMM1 = ZEXT1664(CONCAT124(local_268._16_12_,local_268._12_4_));
      local_2e8 = local_268.__align;
      fStack_2e0 = (float)local_268._8_4_;
      local_2dc = (float)local_268._12_4_;
      local_2c8.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_268._32_8_;
      bVar2 = Integrator::IntersectP((Integrator *)this,(Ray *)&local_2e8,this->maxDist);
      auVar17 = in_ZMM1._8_56_;
      iVar4 = 0;
      if (!bVar2) {
        local_37c = this->illumScale;
        auVar18 = (undefined1  [56])0x0;
        SVar27 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                 ::
                 Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                           (local_330,(anon_class_8_1_5ef94505)lambda);
        auVar20._0_8_ = SVar27.values.values._8_8_;
        auVar20._8_56_ = auVar17;
        auVar13._0_8_ = SVar27.values.values._0_8_;
        auVar13._8_56_ = auVar18;
        local_2f8.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
        auVar18 = (undefined1  [56])0x0;
        SVar27 = SampledSpectrum::operator*(&local_2f8,local_37c);
        auVar21._0_8_ = SVar27.values.values._8_8_;
        auVar21._8_56_ = auVar17;
        auVar14._0_8_ = SVar27.values.values._0_8_;
        auVar14._8_56_ = auVar18;
        auVar5 = vmovlhps_avx(auVar14._0_16_,auVar21._0_16_);
        local_268.__align = auVar5._0_8_;
        local_268._8_4_ = auVar5._8_4_;
        local_268._12_4_ = auVar5._12_4_;
        auVar5 = vmovshdup_avx(auVar7._0_16_);
        auVar24 = ZEXT416((uint)(z.super_Tuple3<pbrt::Normal3,_float>.z *
                                local_390.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar5 = vfmadd132ss_fma(auVar5,auVar24,
                                 ZEXT416((uint)local_390.super_Tuple3<pbrt::Vector3,_float>.y));
        auVar24 = vfmsub213ss_fma(ZEXT416((uint)local_390.super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)z.super_Tuple3<pbrt::Normal3,_float>.z),auVar24);
        auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ + auVar24._0_4_)),auVar7._0_16_,
                                 ZEXT416((uint)local_390.super_Tuple3<pbrt::Vector3,_float>.x));
        uVar23 = 0;
        uVar16 = auVar5._8_8_;
        SampledSpectrum::SampledSpectrum(&local_2c0,auVar5._0_4_ / (local_380 * 3.1415927));
        SVar27 = SampledSpectrum::operator*((SampledSpectrum *)&local_268.__align,&local_2c0);
        b = SampledWavelengths::PDF(lambda);
        auVar18 = ZEXT856(uVar23);
        auVar17 = ZEXT856(uVar16);
        SVar27 = SafeDiv(SVar27,b);
        in_ZMM1._0_8_ = SVar27.values.values._8_8_;
        in_ZMM1._8_56_ = auVar18;
        auVar15._0_8_ = SVar27.values.values._0_8_;
        auVar15._8_56_ = auVar17;
        local_340.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,in_ZMM1._0_16_);
        iVar4 = 1;
      }
    }
LAB_003d1fe9:
  } while (iVar4 == 2);
  if (iVar4 == 0) {
LAB_003d1ff6:
    SampledSpectrum::SampledSpectrum(&local_340,0.0);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  return (array<float,_4>)(array<float,_4>)local_340;
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist)) {
            SampledSpectrum L = illumScale * illuminant.Sample(lambda) *
                                SampledSpectrum(Dot(wi, n) / (Pi * pdf));
            return SafeDiv(L, lambda.PDF());
        }
    }
    return SampledSpectrum(0.);
}